

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O0

void show_ast_node(Node *n,int indent)

{
  bool bVar1;
  reference ppSVar2;
  undefined8 uVar3;
  FunctionNode *f;
  Stmt *stmt;
  iterator __end2;
  iterator __begin2;
  vector<Stmt_*,_std::allocator<Stmt_*>_> *__range2;
  CompoundStmt *e;
  Return *r;
  Literal *l;
  BinExpr *be;
  UnaryExpr *ue;
  int i;
  int indent_local;
  Node *n_local;
  
  for (ue._0_4_ = 0; (int)ue < indent; ue._0_4_ = (int)ue + 1) {
    printf("  ");
  }
  switch(n->kind) {
  case UnaryExpr:
    printf("UnaryExpr %c\n",(ulong)(uint)(int)(char)n->field_0xc);
    show_ast_node((Node *)n[1]._vptr_Node,indent + 1);
    break;
  case BinExpr:
    printf("BinExpr %c\n",(ulong)(uint)(int)(char)n->field_0xc);
    show_ast_node((Node *)n[1]._vptr_Node,indent + 1);
    show_ast_node(*(Node **)&n[1].kind,indent + 1);
    break;
  case Literal:
    printf("Literal %d\n",(ulong)*(uint *)&n->field_0xc);
    break;
  case Return:
    printf("Return\n");
    if (n[1]._vptr_Node != (_func_int **)0x0) {
      show_ast_node((Node *)n[1]._vptr_Node,indent + 1);
    }
    break;
  case CompoundStmt:
    printf("CompoundStmt\n");
    __end2 = std::vector<Stmt_*,_std::allocator<Stmt_*>_>::begin
                       ((vector<Stmt_*,_std::allocator<Stmt_*>_> *)(n + 1));
    stmt = (Stmt *)std::vector<Stmt_*,_std::allocator<Stmt_*>_>::end
                             ((vector<Stmt_*,_std::allocator<Stmt_*>_> *)(n + 1));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>
                                       *)&stmt), bVar1) {
      ppSVar2 = __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>
                ::operator*(&__end2);
      show_ast_node(&(*ppSVar2)->super_Node,indent + 1);
      __gnu_cxx::__normal_iterator<Stmt_**,_std::vector<Stmt_*,_std::allocator<Stmt_*>_>_>::
      operator++(&__end2);
    }
    break;
  case Function:
    uVar3 = std::__cxx11::string::c_str();
    printf("Function %s\n",uVar3);
    show_ast_node(*(Node **)(*(long *)&n[3].kind + 0x18),indent + 1);
  }
  return;
}

Assistant:

void show_ast_node(Node* n, int indent)
{
  for (int i=0; i<indent; ++i)
    std::printf("  ");

  switch (n->kind) {

    case NodeKind::UnaryExpr: {
      auto ue = static_cast<UnaryExpr*>(n);
      std::printf("UnaryExpr %c\n", ue->op);
      show_ast_node(ue->operand, indent+1);
      break;
    }

    case NodeKind::BinExpr: {
      auto be = static_cast<BinExpr*>(n);
      std::printf("BinExpr %c\n", be->op);
      show_ast_node(be->lhs, indent+1);
      show_ast_node(be->rhs, indent+1);
      break;
    }

    case NodeKind::Literal: {
      auto l = static_cast<Literal*>(n);
      std::printf("Literal %d\n", l->value);
      break;
    }

    case NodeKind::Return: {
      auto r = static_cast<Return*>(n);
      std::printf("Return\n");
      if (r->expr)
        show_ast_node(r->expr, indent+1);
      break;
    }

    case NodeKind::CompoundStmt: {
      auto e = static_cast<CompoundStmt*>(n);
      std::printf("CompoundStmt\n");
      for (Stmt* stmt : e->stmts) {
        show_ast_node(stmt, indent+1);
      }
      break;
    }

    case NodeKind::Function: {
      auto f = static_cast<FunctionNode*>(n);
      std::printf("Function %s\n", f->name.c_str());
      show_ast_node(f->body->block, indent+1);
      break;
    }

  }
}